

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O0

DEFBUF * defendel(Global *global,char *name,int delete)

{
  size_t size_00;
  ulong uVar1;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  size_t size;
  int temp;
  uintptr_t nhash;
  char *np;
  DEFBUF **prevp;
  DEFBUF *dp;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  long local_38;
  char *local_30;
  DEFBUF *local_28;
  DEFBUF *local_20;
  
  local_38 = 0;
  for (local_30 = in_RSI; *local_30 != '\0'; local_30 = local_30 + 1) {
    local_38 = *local_30 + local_38;
  }
  size_00 = (long)local_30 - (long)in_RSI;
  uVar1 = size_00 + local_38;
  local_20 = (DEFBUF *)(in_RDI + 0x958 + (uVar1 & 0x3f) * 8);
  do {
    local_28 = local_20;
    local_20 = local_28->link;
    if (local_20 == (DEFBUF *)0x0) goto LAB_0010999c;
  } while ((local_20->hash != uVar1) ||
          (in_stack_ffffffffffffffc4 = strcmp(local_20->name,in_RSI), in_stack_ffffffffffffffc4 < 0)
          );
  if (in_stack_ffffffffffffffc4 < 1) {
    local_28->link = local_20->link;
    if (local_20->repl != (char *)0x0) {
      Freemem((void *)0x109981);
    }
    Freemem((void *)0x10998b);
  }
  else {
    local_20 = (DEFBUF *)0x0;
  }
LAB_0010999c:
  if (in_EDX == 0) {
    local_20 = (DEFBUF *)
               Getmem((Global *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      size_00);
    local_20->link = local_28->link;
    local_28->link = local_20;
    local_20->hash = uVar1;
    local_20->repl = (char *)0x0;
    local_20->nargs = 0;
    strcpy(local_20->name,in_RSI);
  }
  return local_20;
}

Assistant:

DEFBUF *defendel(struct Global *global,
		 char *name,
		 int delete) 		/* TRUE to delete a symbol */
{
  /*
   * Enter this name in the lookup table (delete = FALSE)
   * or delete this name (delete = TRUE).
   * Returns a pointer to the define block (delete = FALSE)
   * Returns NULL if the symbol wasn't defined (delete = TRUE).
   */

  DEFBUF *dp;
  DEFBUF **prevp;
  char *np;
  uintptr_t nhash;
  int temp;
  size_t size;
  
  for (nhash = 0, np = name; *np != EOS;)
    nhash += *np++;
  size = (np - name);
  nhash += size;
  prevp = &global->symtab[nhash % SBSIZE];
  while ((dp = *prevp) != (DEFBUF *) NULL) {
    if (dp->hash == nhash
	&& (temp = strcmp(dp->name, name)) >= 0) {
      if (temp > 0)
	dp = NULL;			/* Not found		*/
      else {
	*prevp = dp->link;		/* Found, unlink and	*/
	if (dp->repl != NULL)       	/* Free the replacement */
	  Freemem(dp->repl);         	/* if any, and then     */
	Freemem((char *) dp);          	/* Free the symbol      */
      }
      break;
    }
    prevp = &dp->link;
  }
  if (!delete) {
    dp = (DEFBUF *) Getmem(global, (int) (sizeof (DEFBUF) + size));
    dp->link = *prevp;
    *prevp = dp;
    dp->hash = nhash;
    dp->repl = NULL;
    dp->nargs = 0;
    strcpy(dp->name, name);
  }
  return(dp);
}